

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
          (QMovableArrayOps<QPersistentModelIndex> *this,qsizetype i,QPersistentModelIndex *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  QPersistentModelIndex *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QPersistentModelIndex tmp;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar6;
  Inserter *this_00;
  QPersistentModelIndex local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QPersistentModelIndex>::needsDetach
                    ((QArrayDataPointer<QPersistentModelIndex> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QPersistentModelIndex>::freeSpaceAtEnd
                          ((QArrayDataPointer<QPersistentModelIndex> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      QArrayDataPointer<QPersistentModelIndex>::end
                ((QArrayDataPointer<QPersistentModelIndex> *)in_RDI);
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)in_RDI,
                 (QPersistentModelIndex *)
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      in_RDI->displaceTo = (QPersistentModelIndex *)((long)&in_RDI->displaceTo->d + 1);
      goto LAB_008ee61a;
    }
    if ((in_RSI == (QPersistentModelIndex *)0x0) &&
       (qVar3 = QArrayDataPointer<QPersistentModelIndex>::freeSpaceAtBegin
                          ((QArrayDataPointer<QPersistentModelIndex> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      QArrayDataPointer<QPersistentModelIndex>::begin
                ((QArrayDataPointer<QPersistentModelIndex> *)0x8ee4f4);
      QPersistentModelIndex::QPersistentModelIndex
                ((QPersistentModelIndex *)in_RDI,
                 (QPersistentModelIndex *)
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QPersistentModelIndex *)((long)&in_RDI->displaceTo->d + 1);
      goto LAB_008ee61a;
    }
  }
  local_10.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::QPersistentModelIndex
            ((QPersistentModelIndex *)in_RDI,
             (QPersistentModelIndex *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98))
  ;
  bVar4 = in_RDI->displaceTo != (QPersistentModelIndex *)0x0;
  uVar5 = bVar4 && in_RSI == (QPersistentModelIndex *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QPersistentModelIndex *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QPersistentModelIndex>::detachAndGrow
            ((QArrayDataPointer<QPersistentModelIndex> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QPersistentModelIndex **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffffac,uVar2))),
             (QArrayDataPointer<QPersistentModelIndex> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QPersistentModelIndex> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffffac,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_ffffffffffffff98));
    Inserter::insertOne(in_RDI,(QPersistentModelIndex *)CONCAT17(uVar5,in_stack_ffffffffffffff98));
    Inserter::~Inserter(in_RDI);
  }
  else {
    QArrayDataPointer<QPersistentModelIndex>::begin
              ((QArrayDataPointer<QPersistentModelIndex> *)0x8ee5ae);
    QPersistentModelIndex::QPersistentModelIndex
              ((QPersistentModelIndex *)in_RDI,
               (QPersistentModelIndex *)CONCAT17(uVar5,in_stack_ffffffffffffff98));
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QPersistentModelIndex *)((long)&in_RDI->displaceTo->d + 1);
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_10);
LAB_008ee61a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }